

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
::SearchFrom(iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
             *this,size_type start_bucket)

{
  ulong uVar1;
  void **ppvVar2;
  Node *pNVar3;
  Tree *tree;
  size_type sVar4;
  
  this->node_ = (Node *)0x0;
  uVar1 = this->m_->num_buckets_;
  sVar4 = start_bucket;
  if (start_bucket < uVar1) {
    ppvVar2 = this->m_->table_;
    do {
      pNVar3 = (Node *)ppvVar2[start_bucket];
      if (pNVar3 != (Node *)0x0) {
        if (pNVar3 != (Node *)ppvVar2[start_bucket ^ 1]) {
          this->bucket_index_ = start_bucket;
          this->node_ = pNVar3;
          return;
        }
        if ((pNVar3 != (Node *)0x0) && (pNVar3 == (Node *)ppvVar2[start_bucket ^ 1])) {
          this->bucket_index_ = start_bucket;
          this->node_ = *(Node **)(pNVar3[1].kv.k_.val_.int64_value_ + 0x20);
          return;
        }
      }
      start_bucket = start_bucket + 1;
      sVar4 = uVar1;
    } while (uVar1 != start_bucket);
  }
  this->bucket_index_ = sVar4;
  return;
}

Assistant:

void SearchFrom(size_type start_bucket) {
        GOOGLE_DCHECK(m_->index_of_first_non_null_ == m_->num_buckets_ ||
               m_->table_[m_->index_of_first_non_null_] != NULL);
        node_ = NULL;
        for (bucket_index_ = start_bucket; bucket_index_ < m_->num_buckets_;
             bucket_index_++) {
          if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
            node_ = static_cast<Node*>(m_->table_[bucket_index_]);
            break;
          } else if (m_->TableEntryIsTree(bucket_index_)) {
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            GOOGLE_DCHECK(!tree->empty());
            node_ = NodePtrFromKeyPtr(*tree->begin());
            break;
          }
        }
      }